

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode Curl_http2_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  undefined1 *puVar1;
  Curl_http2_dep *pCVar2;
  Curl_http2_dep *pCVar3;
  Curl_http2_dep *pCVar4;
  Curl_http2_dep *pCVar5;
  Curl_http2_dep *pCVar6;
  
  if (parent != (Curl_easy *)0x0) {
    pCVar2 = (Curl_http2_dep *)(*Curl_ccalloc)(1,0x10);
    if (pCVar2 == (Curl_http2_dep *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar2->data = child;
    pCVar3 = (Curl_http2_dep *)&(parent->set).stream_dependents;
    pCVar4 = (parent->set).stream_dependents;
    pCVar5 = pCVar4;
    if (exclusive && pCVar4 != (Curl_http2_dep *)0x0) {
      for (; pCVar5 != (Curl_http2_dep *)0x0; pCVar5 = pCVar5->next) {
        (pCVar5->data->set).stream_depends_on = child;
      }
      pCVar5 = (Curl_http2_dep *)&(child->set).stream_dependents;
      do {
        pCVar6 = pCVar5;
        pCVar5 = pCVar6->next;
      } while (pCVar5 != (Curl_http2_dep *)0x0);
      pCVar6->next = pCVar4;
      *(Curl_http2_dep **)pCVar3 = (Curl_http2_dep *)0x0;
      pCVar4 = (Curl_http2_dep *)0x0;
    }
    while (pCVar4 != (Curl_http2_dep *)0x0) {
      puVar1 = &(pCVar4->data->set).field_0x8e2;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffdfffffffffff;
      pCVar3 = pCVar3->next;
      pCVar4 = pCVar3->next;
    }
    pCVar3->next = pCVar2;
  }
  (child->set).stream_depends_on = parent;
  *(ulong *)&(child->set).field_0x8e2 =
       *(ulong *)&(child->set).field_0x8e2 & 0xffffdfffffffffff | (ulong)exclusive << 0x2d;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http2_add_child(struct Curl_easy *parent,
                              struct Curl_easy *child,
                              bool exclusive)
{
  if(parent) {
    struct Curl_http2_dep **tail;
    struct Curl_http2_dep *dep = calloc(1, sizeof(struct Curl_http2_dep));
    if(!dep)
      return CURLE_OUT_OF_MEMORY;
    dep->data = child;

    if(parent->set.stream_dependents && exclusive) {
      struct Curl_http2_dep *node = parent->set.stream_dependents;
      while(node) {
        node->data->set.stream_depends_on = child;
        node = node->next;
      }

      tail = &child->set.stream_dependents;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.stream_dependents;
      parent->set.stream_dependents = 0;
    }

    tail = &parent->set.stream_dependents;
    while(*tail) {
      (*tail)->data->set.stream_depends_e = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = dep;
  }

  child->set.stream_depends_on = parent;
  child->set.stream_depends_e = exclusive;
  return CURLE_OK;
}